

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O1

vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
* libcellml::getImportedComponents
            (vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
             *__return_storage_ptr__,ComponentEntityConstPtr *componentEntity)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  ComponentPtr component;
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  childImportedComponents;
  ComponentEntity local_68;
  ComponentEntityConstPtr local_58;
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = 0;
  while( true ) {
    sVar2 = ComponentEntity::componentCount
                      ((componentEntity->
                       super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr);
    if (sVar2 <= uVar3) break;
    ComponentEntity::component
              (&local_68,
               (size_t)(componentEntity->
                       super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr);
    bVar1 = ImportedEntity::isImport
                      ((ImportedEntity *)
                       ((long)local_68.super_NamedEntity.super_ParentedEntity.super_Entity.
                              _vptr_Entity + 0x10));
    if (bVar1) {
      std::
      vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_68);
    }
    local_58.super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_68.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity
    ;
    local_58.super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_68.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)
         ((long)local_68.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
             *(_Atomic_word *)
              ((long)local_68.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)
         ((long)local_68.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) =
             *(_Atomic_word *)
              ((long)local_68.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl + 8) + 1;
      }
    }
    getImportedComponents(&local_48,&local_58);
    if (local_58.super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.
                 super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::reserve(__return_storage_ptr__,
              ((long)local_48.
                     super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_48.
                     super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) +
              ((long)(__return_storage_ptr__->
                     super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(__return_storage_ptr__->
                     super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4));
    std::
    vector<std::shared_ptr<libcellml::Component>,std::allocator<std::shared_ptr<libcellml::Component>>>
    ::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::Component>*,std::vector<std::shared_ptr<libcellml::Component>,std::allocator<std::shared_ptr<libcellml::Component>>>>>
              ((vector<std::shared_ptr<libcellml::Component>,std::allocator<std::shared_ptr<libcellml::Component>>>
                *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               local_48.
               super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_48.
               super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::~vector(&local_48);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_68.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    }
    uVar3 = uVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ComponentPtr> getImportedComponents(const ComponentEntityConstPtr &componentEntity)
{
    std::vector<ComponentPtr> importedComponents;
    for (size_t i = 0; i < componentEntity->componentCount(); ++i) {
        auto component = componentEntity->component(i);
        if (component->isImport()) {
            importedComponents.push_back(component);
        }

        auto childImportedComponents = getImportedComponents(component);
        importedComponents.reserve(importedComponents.size() + childImportedComponents.size());
        importedComponents.insert(importedComponents.end(), childImportedComponents.begin(), childImportedComponents.end());
    }

    return importedComponents;
}